

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MappedValues.cpp
# Opt level: O1

unsigned_long
Maps::getMapKeyByValue<unsigned_long,TileSize>
          (map<unsigned_long,_TileSize,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TileSize>_>_>
           *pairs,TileSize value)

{
  _Rb_tree_node_base *p_Var1;
  undefined8 *puVar2;
  unsigned_long unaff_RBX;
  _Rb_tree_header *p_Var3;
  bool bVar4;
  bool bVar5;
  
  p_Var1 = (pairs->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(pairs->_M_t)._M_impl.super__Rb_tree_header;
  bVar4 = (_Rb_tree_header *)p_Var1 == p_Var3;
  if (!bVar4) {
    unaff_RBX = *(unsigned_long *)(p_Var1 + 1);
    bVar5 = *(TileSize *)&p_Var1[1]._M_parent == value;
    while (!bVar5) {
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
      bVar4 = (_Rb_tree_header *)p_Var1 == p_Var3;
      if (bVar4) break;
      bVar5 = *(TileSize *)&p_Var1[1]._M_parent == value;
      if (bVar5) {
        unaff_RBX = *(unsigned_long *)(p_Var1 + 1);
      }
    }
  }
  if (!bVar4) {
    return unaff_RBX;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "Exception : no key found in a map for a provided value";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

T Maps::getMapKeyByValue( const std::map<T, U>& pairs, U value )
{
    for ( auto& pair : pairs )
    {
        if ( pair.second == value )
        {
            return pair.first;
        }
    }
    throw "Exception : no key found in a map for a provided value";
}